

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_relative_pose.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  long *plVar2;
  DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *pDVar3;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pDVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar22;
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar23;
  timeval tVar24;
  timeval tic;
  timeval toc;
  transformation_t nonlinear_transformation;
  translation_t t_perturbed;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  translation_t position;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  MatrixXd gt;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position1;
  vector<int,_std::allocator<int>_> indices10;
  vector<int,_std::allocator<int>_> indices5;
  CentralRelativeAdapter adapter;
  rotation_t R_perturbed;
  translation_t twopt_translation;
  translation_t position2;
  rotation_t rotation1;
  rotation_t rotation;
  transformation_t nonlinear_transformation_10;
  rotation_t eigensolver_rotation;
  essential_t eightpt_essential;
  rotation_t rotation2;
  timeval local_658;
  timeval local_648;
  DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *local_638;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_630;
  double dStack_628;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_620;
  double dStack_618;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_610;
  double dStack_608;
  essential_t local_600;
  double dStack_5b8;
  double dStack_5b0;
  double dStack_5a8;
  double local_590;
  double dStack_588;
  translation_t local_580;
  bearingVectors_t local_560;
  bearingVectors_t local_540;
  __suseconds_t local_528;
  __time_t local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  translation_t local_4e8;
  vector<int,_std::allocator<int>_> local_4d0;
  vector<int,_std::allocator<int>_> local_4b0;
  double local_490;
  double dStack_488;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_480;
  double dStack_478;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_470;
  double dStack_468;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_460;
  double dStack_458;
  DenseStorage<double,__1,__1,__1,_0> local_450;
  rotations_t local_430;
  translations_t local_410;
  translation_t local_3f0;
  vector<int,_std::allocator<int>_> local_3d8;
  vector<int,_std::allocator<int>_> local_3c0;
  CentralRelativeAdapter local_3a8;
  rotation_t local_330;
  double local_2e0;
  double dStack_2d8;
  double local_2d0;
  Vector3d local_2c8;
  rotation_t local_2b0;
  rotation_t local_268;
  transformation_t local_220;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double dStack_198;
  double dStack_190;
  double dStack_188;
  double local_180;
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double dStack_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  Matrix3d local_c0 [2];
  
  opengv::initializeRandomSeed();
  local_3f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_3f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_3f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_2c8,2.0);
  opengv::generateRandomRotation(local_c0,0.5);
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&local_410,&local_430);
  local_540.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_540.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_540.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_560.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_560.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_560.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_450.m_cols = 0;
  local_450.m_data = (double *)0x0;
  local_450.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_450,0x1e,3,10);
  opengv::generateRandom2D2DCorrespondences
            (&local_3f0,&local_2b0,&local_2c8,local_c0,&local_410,&local_430,10,0.0,0.0,&local_540,
             &local_560,&local_4b0,&local_4d0,(MatrixXd *)&local_450);
  opengv::extractRelativePose(&local_3f0,&local_2c8,&local_2b0,local_c0,&local_4e8,&local_268,true);
  opengv::printExperimentCharacteristics(&local_4e8,&local_268,0.0,0.0);
  opengv::printEssentialMatrix(&local_4e8,&local_268);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&local_3a8,&local_540,&local_560,&local_268);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"running twopt",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    opengv::relative_pose::twopt
              ((translation_t *)&local_600,&local_3a8.super_RelativeAdapterBase,true,0,1);
    local_2d0 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2];
    local_2e0 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    dStack_2d8 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1];
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running fivept_stewenius",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar6._0_8_ = (double)tVar23.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = (double)tVar24.tv_usec;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar14,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_4f0 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  local_610 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  dStack_608 = 0.0;
  pDVar3 = (DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)0x0;
  do {
    opengv::relative_pose::fivept_stewenius
              ((complexEssentials_t *)&local_600,&local_3a8.super_RelativeAdapterBase);
    local_638 = (DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    local_460 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    dStack_458 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0) << 0x20;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    if (pDVar3 != (DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)0x0) {
      free(*(void **)(pDVar3 + -8));
    }
    if (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] != 0.0) {
      free(*(void **)((long)local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] + -8));
    }
    lVar5 = lVar5 + -1;
    local_610 = local_460;
    dStack_608 = dStack_458;
    pDVar3 = local_638;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running fivept_nister",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar7._0_8_ = (double)tVar23.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = (double)tVar24.tv_usec;
  auVar15._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar15,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_4f8 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  local_630 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  dStack_628 = 0.0;
  pDVar4 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  do {
    opengv::relative_pose::fivept_nister
              ((essentials_t *)&local_600,&local_3a8.super_RelativeAdapterBase);
    local_610 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    local_470 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    dStack_468 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0) << 0x20;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
      free(*(void **)(pDVar4 + -8));
    }
    if (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] != 0.0) {
      free(*(void **)((long)local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] + -8));
    }
    lVar5 = lVar5 + -1;
    local_630 = local_470;
    dStack_628 = dStack_468;
    pDVar4 = local_610;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running fivept_kneip",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  opengv::getNindices(&local_3c0,5);
  auVar8._0_8_ = (double)tVar23.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar16._0_8_ = (double)tVar24.tv_usec;
  auVar16._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar16,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_500 = auVar6._0_8_ / 50.0;
  lVar5 = 0x32;
  local_620 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  dStack_618 = 0.0;
  pDVar4 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  do {
    opengv::relative_pose::fivept_kneip
              ((rotations_t *)&local_600,&local_3a8.super_RelativeAdapterBase,&local_3c0);
    local_630 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    local_480 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    dStack_478 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0) << 0x20;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
      free(*(void **)(pDVar4 + -8));
    }
    if (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] != 0.0) {
      free(*(void **)((long)local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] + -8));
    }
    lVar5 = lVar5 + -1;
    local_620 = local_480;
    dStack_618 = dStack_478;
    pDVar4 = local_630;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"running sevenpt",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar9._0_8_ = (double)tVar23.tv_sec;
  auVar9._8_8_ = in_XMM2_Qb;
  auVar17._0_8_ = (double)tVar24.tv_usec;
  auVar17._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar17,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_508 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  local_590 = 0.0;
  dStack_588 = 0.0;
  pDVar4 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0;
  do {
    opengv::relative_pose::sevenpt((essentials_t *)&local_600,&local_3a8.super_RelativeAdapterBase);
    local_620 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    local_490 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    dStack_488 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0) << 0x20;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
      free(*(void **)(pDVar4 + -8));
    }
    if (local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] != 0.0) {
      free(*(void **)((long)local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[0] + -8));
    }
    lVar5 = lVar5 + -1;
    local_590 = local_490;
    dStack_588 = dStack_488;
    pDVar4 = local_620;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"running eightpt",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar10._0_8_ = (double)tVar23.tv_sec;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar18._0_8_ = (double)tVar24.tv_usec;
  auVar18._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar18,auVar10,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_590 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    opengv::relative_pose::eightpt(&local_600,&local_3a8.super_RelativeAdapterBase);
    local_100 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[8];
    local_140 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    dStack_138 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1];
    dStack_130 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    dStack_128 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
    dStack_120 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4];
    dStack_118 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5];
    dStack_110 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
    dStack_108 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed rotation and ",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running eigensolver",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_4e8,&local_268,&local_580,&local_330,0.01);
  auVar11._0_8_ = (double)tVar23.tv_sec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar19._0_8_ = (double)tVar24.tv_usec;
  auVar19._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar19,auVar11,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_510 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    opengv::relative_pose::eigensolver(&local_600,&local_3a8.super_RelativeAdapterBase,false);
    local_180 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[8];
    local_1c0 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
    dStack_1b8 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1];
    dStack_1b0 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
    dStack_1a8 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
    dStack_1a0 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4];
    dStack_198 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5];
    dStack_190 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
    dStack_188 = local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_4e8,&local_268,&local_580,&local_330,0.1);
  auVar12._0_8_ = (double)tVar23.tv_sec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar20._0_8_ = (double)tVar24.tv_usec;
  auVar20._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar20,auVar12,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_518 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    local_3a8.super_RelativeAdapterBase._t12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    local_3a8.super_RelativeAdapterBase._t12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_3a8.super_RelativeAdapterBase._t12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    local_3a8.super_RelativeAdapterBase._R12.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    opengv::relative_pose::optimize_nonlinear(&local_220,&local_3a8.super_RelativeAdapterBase);
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
    dStack_5b8 = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[9];
    dStack_5b0 = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[10];
    dStack_5a8 = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0xb];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = local_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  tVar23 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  tVar24 = timeval_minus((timeval *)&local_648,(timeval *)&local_658);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization with 10 indices",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_528 = tVar24.tv_usec;
  local_520 = tVar23.tv_sec;
  opengv::getNindices(&local_3d8,10);
  opengv::getPerturbedPose(&local_4e8,&local_268,&local_580,&local_330,0.1);
  local_3a8.super_RelativeAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_3a8.super_RelativeAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_3a8.super_RelativeAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_3a8.super_RelativeAdapterBase._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  opengv::relative_pose::optimize_nonlinear
            (&local_220,&local_3a8.super_RelativeAdapterBase,&local_3d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from two-points algorithm:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from stewenius\' five-point algorithm:",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)local_460 - (long)local_638 != 0) {
    lVar5 = ((long)local_460 - (long)local_638 >> 4) * -0x71c71c71c71c71c7;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar3 = local_638;
    do {
      poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      pDVar3 = pDVar3 + 0x90;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nisters\' five-point algorithm:",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)local_470 - (long)local_610 != 0) {
    lVar5 = ((long)local_470 - (long)local_610 >> 3) * -0x71c71c71c71c71c7;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar4 = local_610;
    do {
      poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      pDVar4 = pDVar4 + 0x48;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from kneip\'s five-point algorithm:",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)local_480 - (long)local_630 != 0) {
    lVar5 = ((long)local_480 - (long)local_630 >> 3) * -0x71c71c71c71c71c7;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar4 = local_630;
    do {
      poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      pDVar4 = pDVar4 + 0x48;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from seven-point algorithm:",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)local_490 - (long)local_620 != 0) {
    lVar5 = ((long)local_490 - (long)local_620 >> 3) * -0x71c71c71c71c71c7;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar4 = local_620;
    do {
      poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      pDVar4 = pDVar4 + 0x48;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from eight-point algorithm:",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from eigensystem based rotation solver:",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm:",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_600);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm with only few correspondences:"
             ,0x3f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_220);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from two-points algorithm: ",0x23);
  poVar1 = std::ostream::_M_insert<double>(local_4f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from stewenius\' five-point algorithm: ",0x2e);
  poVar1 = std::ostream::_M_insert<double>(local_4f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from nisters\' five-point algorithm: ",0x2c);
  poVar1 = std::ostream::_M_insert<double>(local_500);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from kneip\'s five-point algorithm: ",0x2b);
  poVar1 = std::ostream::_M_insert<double>(local_508);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from seven-point algorithm: ",0x24);
  poVar1 = std::ostream::_M_insert<double>(local_590);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from eight-point algorithm: ",0x24);
  poVar1 = std::ostream::_M_insert<double>(local_510);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from eigensystem based rotation solver: ",0x30);
  poVar1 = std::ostream::_M_insert<double>(local_518);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  uVar22 = extraout_XMM1_Qb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from nonlinear algorithm: ",0x22);
  auVar13._0_8_ = (double)local_520;
  auVar13._8_8_ = uVar22;
  auVar21._0_8_ = (double)local_528;
  auVar21._8_8_ = uVar22;
  auVar6 = vfmadd132sd_fma(auVar21,auVar13,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar1 = std::ostream::_M_insert<double>(auVar6._0_8_ / 50.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pDVar4 = local_610;
  if (local_620 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
    free(*(void **)(local_620 + -8));
  }
  if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_630 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
    free(*(void **)(local_630 + -8));
  }
  if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
    free(*(void **)(pDVar4 + -8));
  }
  if (local_638 != (DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)0x0) {
    free(*(void **)(local_638 + -8));
  }
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&local_3a8);
  if (local_450.m_data != (double *)0x0) {
    free((void *)local_450.m_data[-1]);
  }
  if (local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_560.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_560.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_540.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_540.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_430.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_430.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (local_410.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_410.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //compute and print the essential-matrix
  printEssentialMatrix( position, rotation );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //running experiments
  std::cout << "running twopt" << std::endl;
  translation_t twopt_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    twopt_translation = relative_pose::twopt(adapter,true);
  gettimeofday( &toc, 0 );
  double twopt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_stewenius" << std::endl;
  complexEssentials_t fivept_stewenius_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_stewenius_essentials = relative_pose::fivept_stewenius(adapter);
  gettimeofday( &toc, 0 );
  double fivept_stewenius_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_nister" << std::endl;
  essentials_t fivept_nister_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_nister_essentials = relative_pose::fivept_nister(adapter);
  gettimeofday( &toc, 0 );
  double fivept_nister_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_kneip" << std::endl;
  rotations_t fivept_kneip_rotations;
  gettimeofday( &tic, 0 );
  std::vector<int> indices5 = getNindices(5);
  for(size_t i = 0; i < iterations; i++)
    fivept_kneip_rotations = relative_pose::fivept_kneip(adapter,indices5);
  gettimeofday( &toc, 0 );
  double fivept_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running sevenpt" << std::endl;
  essentials_t sevenpt_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    sevenpt_essentials = relative_pose::sevenpt(adapter);
  gettimeofday( &toc, 0 );
  double sevenpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running eightpt" << std::endl;
  essential_t eightpt_essential;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    eightpt_essential = relative_pose::eightpt(adapter);
  gettimeofday( &toc, 0 );
  double eightpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed rotation and ";
  std::cout << "running eigensolver" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  rotation_t eigensolver_rotation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.setR12(R_perturbed);
    eigensolver_rotation = relative_pose::eigensolver(adapter);
  }
  gettimeofday( &toc, 0 );
  double eigensolver_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett12(t_perturbed);
    adapter.setR12(R_perturbed);
    nonlinear_transformation = relative_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 indices" << std::endl;
  std::vector<int> indices10 = getNindices(10);
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      relative_pose::optimize_nonlinear(adapter,indices10);

  //print results
  std::cout << "results from two-points algorithm:" << std::endl;
  std::cout << twopt_translation << std::endl << std::endl;
  std::cout << "results from stewenius' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_stewenius_essentials.size(); i++ )
    std::cout << fivept_stewenius_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from nisters' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_nister_essentials.size(); i++ )
    std::cout << fivept_nister_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from kneip's five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_kneip_rotations.size(); i++ )
    std::cout << fivept_kneip_rotations.at(i) << std::endl << std::endl;
  std::cout << "results from seven-point algorithm:" << std::endl;
  for( size_t i = 0; i < sevenpt_essentials.size(); i++ )
    std::cout << sevenpt_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from eight-point algorithm:" << std::endl;
  std::cout << eightpt_essential << std::endl << std::endl;
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only few correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from two-points algorithm: ";
  std::cout << twopt_time << std::endl;
  std::cout << "timings from stewenius' five-point algorithm: ";
  std::cout << fivept_stewenius_time << std::endl;
  std::cout << "timings from nisters' five-point algorithm: ";
  std::cout << fivept_nister_time << std::endl;
  std::cout << "timings from kneip's five-point algorithm: ";
  std::cout << fivept_kneip_time << std::endl;
  std::cout << "timings from seven-point algorithm: ";
  std::cout << sevenpt_time << std::endl;
  std::cout << "timings from eight-point algorithm: ";
  std::cout << eightpt_time << std::endl;
  std::cout << "timings from eigensystem based rotation solver: ";
  std::cout << eigensolver_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}